

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

Index __thiscall
MADPComponentDiscreteObservations::IndividualToJointObservationIndices
          (MADPComponentDiscreteObservations *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jo_e,Scope *agSC)

{
  Index IVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_A_e;
  allocator_type local_39;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,
             (long)(agSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(agSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2,&local_39);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
            (&this->_m_nrObservations,agSC,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38);
  IVar1 = IndexTools::IndividualToJointIndices
                    (jo_e,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  return IVar1;
}

Assistant:

Index MADPComponentDiscreteObservations::
IndividualToJointObservationIndices(
        const std::vector<Index>& jo_e, const Scope& agSC) const
{ 
    vector<size_t> nr_A_e(agSC.size());
    IndexTools::RestrictIndividualIndicesToScope(
        GetNrObservations(), agSC, nr_A_e);
    Index joI = IndexTools::IndividualToJointIndices( jo_e, nr_A_e);
    return(joI);
}